

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::uncheckedEnqueue(Solver *this,Lit p,int level,CRef from)

{
  double *pdVar1;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  uint uVar2;
  VarData VVar3;
  int iVar4;
  double dVar5;
  
  iVar4 = p.x >> 1;
  if (VSIDS_DISTANCE < this->current_heuristic) {
    uVar2 = (uint)this->conflicts;
    (this->picked).data[iVar4] = uVar2;
    (this->conflicted).data[iVar4] = 0;
    (this->almost_conflicted).data[iVar4] = 0;
    uVar2 = uVar2 - (this->canceled).data[iVar4];
    if (uVar2 != 0) {
      dVar5 = pow(0.95,(double)uVar2);
      pdVar1 = (this->activity_CHB).data;
      pdVar1[iVar4] = dVar5 * pdVar1[iVar4];
      if (((this->current_heuristic == CHB) &&
          (this_00 = this->order_heap, iVar4 < (this_00->indices).sz)) &&
         (-1 < (this_00->indices).data[iVar4])) {
        Heap<Minisat::Solver::VarOrderLt>::percolateDown(this_00,(this_00->indices).data[iVar4]);
      }
    }
  }
  (this->assigns).data[iVar4].value = (byte)p.x & 1;
  VVar3.level = level;
  VVar3.reason = from;
  (this->vardata).data[iVar4] = VVar3;
  iVar4 = (this->trail).sz;
  (this->trail).sz = iVar4 + 1;
  (this->trail).data[iVar4].x = p.x;
  return;
}

Assistant:

void Solver::uncheckedEnqueue(Lit p, int level, CRef from)
{
    assert(value(p) == l_Undef);
    assert(level <= decisionLevel() && "do not enqueue literals on non-existing levels");
    assert((from == CRef_Undef || from < ca.size()) && "do not use reasons that are not located in the allocator");
    Var x = var(p);
    if (!usesVSIDS()) {
        picked[x] = conflicts;
        conflicted[x] = 0;
        almost_conflicted[x] = 0;
#ifdef ANTI_EXPLORATION
        uint32_t age = conflicts - canceled[var(p)];
        if (age > 0) {
            double decay = pow(0.95, age);
            activity_CHB[var(p)] *= decay;
            if (usesCHB() && order_heap->inHeap(var(p))) order_heap->increase(var(p));
        }
#endif
    }

    assigns[x] = lbool(!sign(p));
    vardata[x] = mkVarData(from, level);
    __builtin_prefetch(&watches[p], 1, 0); // prefetch the watch, prepare for a write (1), the data is highly temoral (0)
    trail.push_(p);
}